

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

ctmbstr prvTidytidyLocalizedString(uint messageType,languageDefinition *definition,uint plural)

{
  uint uVar1;
  ctmbstr ptVar2;
  uint *puVar3;
  
  uVar1 = (*definition->whichPluralForm)(plural);
  ptVar2 = definition->messages[0].value;
  if (ptVar2 != (ctmbstr)0x0) {
    puVar3 = &definition->messages[0].pluralForm;
    do {
      if ((((languageDictionaryEntry *)(puVar3 + -1))->key == messageType) && (*puVar3 == uVar1)) {
        return ptVar2;
      }
      ptVar2 = *(ctmbstr *)(puVar3 + 5);
      puVar3 = puVar3 + 4;
    } while (ptVar2 != (ctmbstr)0x0);
  }
  return (ctmbstr)0x0;
}

Assistant:

ctmbstr TY_(tidyLocalizedString)( uint messageType, languageDefinition *definition, uint plural )
{
    int i;
    languageDictionary *dictionary = &definition->messages;
    uint pluralForm = definition->whichPluralForm(plural);
    
    for (i = 0; (*dictionary)[i].value; ++i)
    {
        if ( (*dictionary)[i].key == messageType && (*dictionary)[i].pluralForm == pluralForm )
        {
            return (*dictionary)[i].value;
        }
    }
    return NULL;
}